

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O3

PropertyQueryFlags __thiscall
Js::CustomExternalWrapperObject::HasPropertyQuery
          (CustomExternalWrapperObject *this,PropertyId propertyId,PropertyValueInfo *info)

{
  ImplicitCallFlags IVar1;
  ScriptContext *scriptContext;
  ThreadContext *this_00;
  Var aValue;
  JavascriptFunction *pJVar2;
  bool bVar3;
  BOOL BVar4;
  PropertyQueryFlags PVar5;
  Attributes attributes;
  HostScriptContext *pHVar6;
  JavascriptMethod p_Var7;
  RecyclableObject *ptr;
  Recycler *this_01;
  Var local_68;
  Var isPropertyNameNumeric;
  Var propertyNameNumericValue;
  Var local_50;
  Var local_48;
  JavascriptFunction *local_40;
  bool local_31;
  
  scriptContext =
       (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  bVar3 = false;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  this_00 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  pHVar6 = ThreadContext::GetPreviousHostScriptContext(this_00);
  propertyNameNumericValue = pHVar6->scriptContext;
  BVar4 = EnsureInitialized(this,(ScriptContext *)propertyNameNumericValue);
  if (BVar4 == 0) goto LAB_00b3097f;
  aValue = *(Var *)&((this->super_DynamicObject).super_RecyclableObject.type.ptr[1].propertyCache.
                    ptr)->elements[2].field_0x8;
  if (aValue != (Var)0x0) {
    local_40 = VarTo<Js::JavascriptFunction>(aValue);
    if (local_40 != (JavascriptFunction *)0x0) {
      this_01 = *(Recycler **)((long)propertyNameNumericValue + 0x1200);
      bVar3 = Memory::Recycler::IsHeapEnumInProgress(this_01);
      if (!bVar3) {
        local_50 = GetName((CustomExternalWrapperObject *)this_01,
                           (ScriptContext *)propertyNameNumericValue,propertyId,&local_68,
                           &isPropertyNameNumeric);
        pJVar2 = local_40;
        if (info != (PropertyValueInfo *)0x0) {
          info->m_instance = (RecyclableObject *)this;
          info->m_propertyIndex = 0xffff;
          info->m_attributes = '\0';
          info->flags = InlineCacheNoFlags;
          *(undefined1 *)&info->cacheInfoFlag =
               (char)info->cacheInfoFlag | disablePrototypeCacheFlag;
        }
        local_48 = local_68;
        local_31 = this_00->reentrancySafeOrHandled;
        this_00->reentrancySafeOrHandled = true;
        attributes = FunctionInfo::GetAttributes((RecyclableObject *)local_40);
        bVar3 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)pJVar2,attributes);
        if (bVar3) {
          ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
          pJVar2 = local_40;
          if (this_00->noJsReentrancy == true) {
            Throw::FatalJsReentrancyError();
          }
          p_Var7 = RecyclableObject::GetEntryPoint((RecyclableObject *)local_40);
          CheckIsExecutable((RecyclableObject *)pJVar2,p_Var7);
          p_Var7 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar2);
          ptr = (RecyclableObject *)
                (*p_Var7)((RecyclableObject *)pJVar2,(CallInfo)pJVar2,0x2000004,0,0,0,0,0x2000004,
                          this,local_50,local_48,isPropertyNameNumeric);
          bVar3 = ThreadContext::IsOnStack(ptr);
LAB_00b30a6e:
          if (bVar3 != false) {
            this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
          }
        }
        else if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag)
        {
          if ((attributes & HasNoSideEffect) != None) {
            ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
            pJVar2 = local_40;
            if (this_00->noJsReentrancy == true) {
              Throw::FatalJsReentrancyError();
            }
            p_Var7 = RecyclableObject::GetEntryPoint((RecyclableObject *)local_40);
            CheckIsExecutable((RecyclableObject *)pJVar2,p_Var7);
            p_Var7 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar2);
            ptr = (RecyclableObject *)
                  (*p_Var7)((RecyclableObject *)pJVar2,(CallInfo)pJVar2,0x2000004,0,0,0,0,0x2000004,
                            this,local_50,local_48,isPropertyNameNumeric);
            bVar3 = ThreadContext::IsOnStack(ptr);
            goto LAB_00b30a6e;
          }
          IVar1 = this_00->implicitCallFlags;
          ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
          pJVar2 = local_40;
          if (this_00->noJsReentrancy == true) {
            Throw::FatalJsReentrancyError();
          }
          p_Var7 = RecyclableObject::GetEntryPoint((RecyclableObject *)local_40);
          CheckIsExecutable((RecyclableObject *)pJVar2,p_Var7);
          p_Var7 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar2);
          ptr = (RecyclableObject *)
                (*p_Var7)((RecyclableObject *)pJVar2,(CallInfo)pJVar2,0x2000004,0,0,0,0,0x2000004,
                          this,local_50,local_48,isPropertyNameNumeric);
          this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
        }
        else {
          this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
          ptr = (((((((((local_40->super_DynamicObject).super_RecyclableObject.type.ptr)->
                      javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                  super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
                undefinedValue.ptr;
        }
        this_00->reentrancySafeOrHandled = local_31;
        BVar4 = JavascriptConversion::ToBoolean(ptr,(ScriptContext *)propertyNameNumericValue);
        bVar3 = BVar4 != 0;
        goto LAB_00b3097f;
      }
    }
  }
  PVar5 = DynamicObject::HasPropertyQuery(&this->super_DynamicObject,propertyId,info);
  bVar3 = PVar5 == Property_Found;
LAB_00b3097f:
  return (PropertyQueryFlags)bVar3;
}

Assistant:

Js::PropertyQueryFlags CustomExternalWrapperObject::HasPropertyQuery(Js::PropertyId propertyId, _Inout_opt_ Js::PropertyValueInfo* info)
{
    auto fn = [&](RecyclableObject* object)->BOOL {
        return JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::HasPropertyQuery(propertyId, info));
    };
    auto getPropertyName = [&](Js::ScriptContext * requestContext, Js::Var * isPropertyNameNumeric, Js::Var * propertyNameNumericValue)->Js::Var
    {
        return GetName(requestContext, propertyId, isPropertyNameNumeric, propertyNameNumericValue);
    };
    return Js::JavascriptConversion::BooleanToPropertyQueryFlags(HasPropertyTrap(fn, getPropertyName, info));
}